

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  pointer this_00;
  pointer pLVar1;
  pointer pLVar2;
  ExprList *pEVar3;
  undefined4 uVar4;
  Enum EVar5;
  ulong uVar6;
  ulong uVar7;
  pointer pLVar8;
  pointer pLVar9;
  long lVar10;
  long lVar11;
  
  this_00 = (this->label_stack_).
            super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->label_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pLVar1 - (long)this_00;
  uVar6 = lVar11 / 0x18;
  if (uVar6 < 0x4000) {
    if (pLVar1 == (this->label_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if (lVar11 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar7 = 1;
      if (pLVar1 != this_00) {
        uVar7 = uVar6;
      }
      lVar11 = uVar7 + uVar6;
      if (lVar11 == 0) {
        pLVar8 = (pointer)0x0;
      }
      else {
        pLVar8 = (pointer)operator_new(lVar11 * 0x18);
      }
      pLVar8[uVar6].label_type = label_type;
      pLVar8[uVar6].exprs = first;
      pLVar8[uVar6].context = context;
      pLVar2 = pLVar8;
      for (pLVar9 = this_00; pLVar9 != pLVar1; pLVar9 = pLVar9 + 1) {
        pLVar2->context = pLVar9->context;
        uVar4 = *(undefined4 *)&pLVar9->field_0x4;
        pEVar3 = pLVar9->exprs;
        pLVar2->label_type = pLVar9->label_type;
        *(undefined4 *)&pLVar2->field_0x4 = uVar4;
        pLVar2->exprs = pEVar3;
        pLVar2 = pLVar2 + 1;
      }
      lVar10 = (long)(this->label_stack_).
                     super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)this_00;
      std::
      _Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ::_M_deallocate((_Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
                       *)this_00,(pointer)(lVar10 / 0x18),lVar10 % 0x18);
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_start = pLVar8;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar2 + 1;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar8 + lVar11;
    }
    else {
      *(LabelType *)&(((_Vector_impl *)&pLVar1->label_type)->super__Vector_impl_data)._M_start =
           label_type;
      pLVar1->exprs = first;
      pLVar1->context = context;
      (this->label_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar1 + 1;
    }
    EVar5 = Ok;
  }
  else {
    PrintError(this,"label stack exceeds max nesting depth",lVar11 % 0x18);
    EVar5 = Error;
  }
  return (Result)EVar5;
}

Assistant:

Result BinaryReaderIR::PushLabel(LabelType label_type,
                                 ExprList* first,
                                 Expr* context) {
  if (label_stack_.size() >= kMaxNestingDepth) {
    PrintError("label stack exceeds max nesting depth");
    return Result::Error;
  }
  label_stack_.emplace_back(label_type, first, context);
  return Result::Ok;
}